

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

uint64_t Catch::ulpDistance<double>(double lhs,double rhs)

{
  uint64_t uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((lhs != rhs) || (NAN(lhs) || NAN(rhs))) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      uVar4 = ~-(ulong)(lhs == 0.0) & (ulong)lhs;
      uVar5 = ~-(ulong)(rhs == 0.0) & (ulong)rhs;
      if (-1 < (long)(uVar5 ^ uVar4)) {
        lVar3 = uVar4 - uVar5;
        if (uVar4 < uVar5 || uVar4 - uVar5 == 0) {
          lVar3 = -(uVar4 - uVar5);
        }
        break;
      }
      uVar1 = ulpDistance<double>((double)(~-(ulong)(lhs == 0.0) & (ulong)ABS(lhs)),0.0);
      lhs = (double)(~-(ulong)(rhs == 0.0) & (ulong)ABS(rhs));
      lVar2 = lVar2 + uVar1;
      rhs = 0.0;
    } while ((lhs != 0.0) || (NAN(lhs)));
  }
  else {
    lVar2 = 0;
    lVar3 = 0;
  }
  return lVar2 + lVar3;
}

Assistant:

uint64_t ulpDistance( FP lhs, FP rhs ) {
        assert( std::numeric_limits<FP>::is_iec559 &&
            "ulpDistance assumes IEEE-754 format for floating point types" );
        assert( !Catch::isnan( lhs ) &&
                "Distance between NaN and number is not meaningful" );
        assert( !Catch::isnan( rhs ) &&
                "Distance between NaN and number is not meaningful" );

        // We want X == Y to imply 0 ULP distance even if X and Y aren't
        // bit-equal (-0 and 0), or X - Y != 0 (same sign infinities).
        if ( lhs == rhs ) { return 0; }

        // We need a properly typed positive zero for type inference.
        static constexpr FP positive_zero{};

        // We want to ensure that +/- 0 is always represented as positive zero
        if ( lhs == positive_zero ) { lhs = positive_zero; }
        if ( rhs == positive_zero ) { rhs = positive_zero; }

        // If arguments have different signs, we can handle them by summing
        // how far are they from 0 each.
        if ( std::signbit( lhs ) != std::signbit( rhs ) ) {
            return ulpDistance( std::abs( lhs ), positive_zero ) +
                   ulpDistance( std::abs( rhs ), positive_zero );
        }

        // When both lhs and rhs are of the same sign, we can just
        // read the numbers bitwise as integers, and then subtract them
        // (assuming IEEE).
        uint64_t lc = Detail::convertToBits( lhs );
        uint64_t rc = Detail::convertToBits( rhs );

        // The ulp distance between two numbers is symmetric, so to avoid
        // dealing with overflows we want the bigger converted number on the lhs
        if ( lc < rc ) {
            std::swap( lc, rc );
        }

        return lc - rc;
    }